

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O0

SQFunctionProto *
SQFunctionProto::Create
          (SQSharedState *ss,SQInteger ninstructions,SQInteger nliterals,SQInteger nparameters,
          SQInteger nfunctions,SQInteger noutervalues,SQInteger nlineinfos,SQInteger nlocalvarinfos,
          SQInteger ndefaultparams)

{
  SQFunctionProto *this;
  long local_68;
  SQInteger n_4;
  SQInteger n_3;
  SQInteger n_2;
  SQInteger n_1;
  SQInteger n;
  SQFunctionProto *f;
  SQInteger noutervalues_local;
  SQInteger nfunctions_local;
  SQInteger nparameters_local;
  SQInteger nliterals_local;
  SQInteger ninstructions_local;
  SQSharedState *ss_local;
  
  this = (SQFunctionProto *)
         sq_vm_malloc((ninstructions + -1) * 8 + 0xe8 + nliterals * 0x10 + nparameters * 0x10 +
                      nfunctions * 0x10 + noutervalues * 0x28 + nlineinfos * 0x10 +
                      nlocalvarinfos * 0x28 + ndefaultparams * 8);
  SQFunctionProto(this,ss);
  this->_ninstructions = ninstructions;
  this->_literals = (SQObjectPtr *)(this->_instructions + ninstructions);
  this->_nliterals = nliterals;
  this->_parameters = this->_literals + nliterals;
  this->_nparameters = nparameters;
  this->_functions = this->_parameters + nparameters;
  this->_nfunctions = nfunctions;
  this->_outervalues = (SQOuterVar *)(this->_functions + nfunctions);
  this->_noutervalues = noutervalues;
  this->_lineinfos = (SQLineInfo *)(this->_outervalues + noutervalues);
  this->_nlineinfos = nlineinfos;
  this->_localvarinfos = (SQLocalVarInfo *)(this->_lineinfos + nlineinfos);
  this->_nlocalvarinfos = nlocalvarinfos;
  this->_defaultparams = (SQInteger *)(this->_localvarinfos + nlocalvarinfos);
  this->_ndefaultparams = ndefaultparams;
  for (n_1 = 0; n_1 < this->_nliterals; n_1 = n_1 + 1) {
    ::SQObjectPtr::SQObjectPtr(this->_literals + n_1);
  }
  for (n_2 = 0; n_2 < this->_nparameters; n_2 = n_2 + 1) {
    ::SQObjectPtr::SQObjectPtr(this->_parameters + n_2);
  }
  for (n_3 = 0; n_3 < this->_nfunctions; n_3 = n_3 + 1) {
    ::SQObjectPtr::SQObjectPtr(this->_functions + n_3);
  }
  for (n_4 = 0; n_4 < this->_noutervalues; n_4 = n_4 + 1) {
    SQOuterVar::SQOuterVar(this->_outervalues + n_4);
  }
  for (local_68 = 0; local_68 < this->_nlocalvarinfos; local_68 = local_68 + 1) {
    SQLocalVarInfo::SQLocalVarInfo(this->_localvarinfos + local_68);
  }
  return this;
}

Assistant:

static SQFunctionProto *Create(SQSharedState *ss,SQInteger ninstructions,
        SQInteger nliterals,SQInteger nparameters,
        SQInteger nfunctions,SQInteger noutervalues,
        SQInteger nlineinfos,SQInteger nlocalvarinfos,SQInteger ndefaultparams)
    {
        SQFunctionProto *f;
        //I compact the whole class and members in a single memory allocation
        f = (SQFunctionProto *)sq_vm_malloc(_FUNC_SIZE(ninstructions,nliterals,nparameters,nfunctions,noutervalues,nlineinfos,nlocalvarinfos,ndefaultparams));
        new (f) SQFunctionProto(ss);
        f->_ninstructions = ninstructions;
        f->_literals = (SQObjectPtr*)&f->_instructions[ninstructions];
        f->_nliterals = nliterals;
        f->_parameters = (SQObjectPtr*)&f->_literals[nliterals];
        f->_nparameters = nparameters;
        f->_functions = (SQObjectPtr*)&f->_parameters[nparameters];
        f->_nfunctions = nfunctions;
        f->_outervalues = (SQOuterVar*)&f->_functions[nfunctions];
        f->_noutervalues = noutervalues;
        f->_lineinfos = (SQLineInfo *)&f->_outervalues[noutervalues];
        f->_nlineinfos = nlineinfos;
        f->_localvarinfos = (SQLocalVarInfo *)&f->_lineinfos[nlineinfos];
        f->_nlocalvarinfos = nlocalvarinfos;
        f->_defaultparams = (SQInteger *)&f->_localvarinfos[nlocalvarinfos];
        f->_ndefaultparams = ndefaultparams;

        _CONSTRUCT_VECTOR(SQObjectPtr,f->_nliterals,f->_literals);
        _CONSTRUCT_VECTOR(SQObjectPtr,f->_nparameters,f->_parameters);
        _CONSTRUCT_VECTOR(SQObjectPtr,f->_nfunctions,f->_functions);
        _CONSTRUCT_VECTOR(SQOuterVar,f->_noutervalues,f->_outervalues);
        //_CONSTRUCT_VECTOR(SQLineInfo,f->_nlineinfos,f->_lineinfos); //not required are 2 integers
        _CONSTRUCT_VECTOR(SQLocalVarInfo,f->_nlocalvarinfos,f->_localvarinfos);
        return f;
    }